

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derived_classes.cpp
# Opt level: O1

void __thiscall Derived21::Print(Derived21 *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Derived21 (",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->super_Base2).id_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  (*((this->super_Base2).printer_)->_vptr_Base1[2])();
  return;
}

Assistant:

void Derived21::Print() const {
  std::cout << "Derived21 (" << id() << "): ";
  printer()->Print();
}